

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmChk<(moira::Instr)32,(moira::Mode)7,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  bool bVar2;
  StrWriter *pSVar3;
  Av<(moira::Instr)32,_(moira::Mode)7,_4> local_54;
  int local_50;
  int local_48;
  Dn local_40;
  undefined1 local_3c [4];
  Dn dst;
  Ea<(moira::Mode)7,_4> src;
  u32 old;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  uVar1 = *addr;
  Op<(moira::Mode)7,4>((Ea<(moira::Mode)7,_4> *)local_3c,this,op & 7,addr);
  Dn::Dn(&local_40,(int)(uint)op >> 9 & 7);
  if ((str->style->syntax != MUSASHI) &&
     (bVar2 = isAvailable(this,this->dasmModel,CHK,AW,4), !bVar2)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)32,(moira::Mode)7,4>(this,str,addr,op);
    return;
  }
  pSVar3 = StrWriter::operator<<(str);
  pSVar3 = StrWriter::operator<<(pSVar3);
  local_48 = (str->tab).raw;
  pSVar3 = StrWriter::operator<<(pSVar3,(Tab)local_48);
  pSVar3 = StrWriter::operator<<(pSVar3,(Ea<(moira::Mode)7,_4> *)local_3c);
  pSVar3 = StrWriter::operator<<(pSVar3);
  local_50 = local_40.raw;
  StrWriter::operator<<(pSVar3,local_40);
  local_54.ext1 = 0;
  StrWriter::operator<<(str,&local_54);
  return;
}

Assistant:

void
Moira::dasmChk(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dst = Dn       ( ____xxx_________(op)       );

    if (str.style.syntax != Syntax::MUSASHI && !isAvailable(dasmModel, I, M, S)) {

        addr = old;
        dasmIllegal<I, M, S>(str, addr, op);
        return;
    }

    str << Ins<I>{} << Sz<S>{} << str.tab << src << Sep{} << dst;
    str << Av<I, M, S>{};
}